

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void ecs_log_print(int level,char *file,int32_t line,char *fmt,__va_list_tag *valist)

{
  char *__s1;
  byte bVar1;
  ushort *puVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  ushort **ppuVar11;
  long lVar12;
  undefined4 in_register_00000014;
  char *str;
  char cVar13;
  bool bVar14;
  char cVar15;
  char cVar16;
  char indent [32];
  ecs_strbuf_t buff;
  char filebuff [256];
  undefined2 local_598 [16];
  ecs_strbuf_t local_578;
  char local_138 [264];
  
  if (level <= trace_level) {
    strcpy(local_138,file);
    pcVar9 = strrchr(local_138,0x2f);
    pcVar10 = pcVar9 + 1;
    if (pcVar9 == (char *)0x0) {
      pcVar10 = local_138;
    }
    pcVar10 = strrchr(pcVar10,0x2e);
    if (pcVar10 != (char *)0x0) {
      *pcVar10 = '\0';
    }
    if ((long)trace_indent < 1) {
      lVar12 = 0;
    }
    else {
      lVar12 = 0;
      do {
        *(undefined2 *)((long)local_598 + lVar12) = 0x207c;
        lVar12 = lVar12 + 2;
      } while ((long)trace_indent * 2 != lVar12);
    }
    *(undefined1 *)((long)local_598 + lVar12) = 0;
    pcVar10 = ecs_vasprintf((char *)CONCAT44(in_register_00000014,line),(__va_list_tag *)fmt);
    memset(&local_578,0,0x440);
    cVar15 = *pcVar10;
    if (cVar15 != '\0') {
      bVar7 = true;
      bVar14 = false;
      bVar5 = false;
      cVar13 = '\0';
      bVar4 = false;
      cVar16 = '\0';
      pcVar9 = pcVar10;
      do {
        if (!bVar14) {
          lVar12 = (long)cVar15;
          if ((((bVar4) && (ppuVar11 = __ctype_b_loc(), ((*ppuVar11)[lVar12] & 0xc00) == 0)) &&
              (cVar15 != '%')) && (cVar15 != '.')) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
            bVar4 = false;
          }
          if (((cVar13 == '\0') || (cVar13 != cVar15)) || (cVar16 == '\\')) {
            if (cVar13 == '\0' && (cVar15 == '\"' || cVar15 == '\'')) {
              ppuVar11 = __ctype_b_loc();
              cVar13 = '\0';
              if ((cVar16 != '\\') && (((*ppuVar11)[cVar16] & 0x400) == 0)) {
                ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
                cVar13 = cVar15;
              }
            }
          }
          else {
            cVar13 = '\0';
          }
          ppuVar11 = __ctype_b_loc();
          puVar2 = *ppuVar11;
          if ((*(byte *)((long)puVar2 + lVar12 * 2 + 1) & 8) == 0) {
            if (cVar15 == '-') {
              bVar1 = *(byte *)((long)puVar2 + (long)pcVar9[1] * 2 + 1);
joined_r0x00116262:
              if ((bVar1 & 8) != 0) goto LAB_00116264;
            }
            else if (cVar15 == '%') {
              bVar1 = *(byte *)((long)puVar2 + (long)cVar16 * 2 + 1);
              goto joined_r0x00116262;
            }
          }
          else {
LAB_00116264:
            if ((((!bVar4) && (cVar13 == '\0')) && (!bVar5)) &&
               ((((puVar2[cVar16] & 0xc00) == 0 && (cVar16 != '.')) && (cVar16 != '_')))) {
              ecs_strbuf_appendstr(&local_578,"\x1b[0;32m");
              bVar4 = true;
            }
          }
          if (((bVar5) && (((*ppuVar11)[lVar12] >> 10 & 1) == 0)) &&
             ((cVar15 != '_' && (((*ppuVar11)[lVar12] & 0x800) == 0)))) {
            ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
            bVar5 = false;
          }
          if (cVar13 == '\0') {
            if ((cVar15 == '$' && !bVar5) &&
               ((*(byte *)((long)*ppuVar11 + (long)pcVar9[1] * 2 + 1) & 4) != 0)) {
              ecs_strbuf_appendstr(&local_578,"\x1b[0;36m");
              bVar5 = true;
            }
            cVar13 = '\0';
          }
        }
        if (((cVar15 != '#' || bVar4) || (cVar13 != '\0' || bVar5)) || (pcVar9[1] != '[')) {
          bVar3 = false;
          cVar16 = cVar15;
        }
        else {
          if (pcVar9[2] == ']') {
            bVar14 = true;
            bVar7 = false;
            bVar3 = true;
          }
          else {
            __s1 = pcVar9 + 2;
            iVar8 = strncmp(__s1,"green]",6);
            bVar3 = true;
            str = "\x1b[0;32m";
            bVar6 = true;
            if (iVar8 != 0) {
              iVar8 = strncmp(__s1,"red]",4);
              str = "\x1b[0;31m";
              bVar6 = true;
              if (iVar8 != 0) {
                iVar8 = strncmp(__s1,"blue]",4);
                str = "\x1b[0;34m";
                bVar6 = true;
                if (iVar8 != 0) {
                  iVar8 = strncmp(__s1,"magenta]",8);
                  str = "\x1b[0;35m";
                  bVar6 = true;
                  if (iVar8 != 0) {
                    iVar8 = strncmp(__s1,"cyan]",5);
                    str = "\x1b[0;36m";
                    bVar6 = true;
                    if (iVar8 != 0) {
                      iVar8 = strncmp(__s1,"yellow]",7);
                      str = "\x1b[0;33m";
                      bVar6 = true;
                      if (iVar8 != 0) {
                        iVar8 = strncmp(__s1,"grey]",5);
                        str = "\x1b[0;37m";
                        bVar6 = true;
                        if (iVar8 != 0) {
                          iVar8 = strncmp(__s1,"white]",6);
                          str = "\x1b[0;49m";
                          bVar6 = true;
                          if (iVar8 != 0) {
                            iVar8 = strncmp(__s1,"bold]",5);
                            str = "\x1b[1;49m";
                            bVar6 = true;
                            if (iVar8 != 0) {
                              iVar8 = strncmp(__s1,"normal]",7);
                              str = "\x1b[0;49m";
                              bVar6 = true;
                              if (iVar8 != 0) {
                                iVar8 = strncmp(__s1,"reset]",6);
                                bVar14 = false;
                                str = "\x1b[0;49m";
                                bVar6 = false;
                                if (iVar8 != 0) {
                                  bVar3 = false;
                                  goto LAB_001164f9;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            bVar14 = bVar6;
            ecs_strbuf_appendstr(&local_578,str);
          }
LAB_001164f9:
          if (bVar3) {
            pcVar9 = pcVar9 + 1;
            do {
              cVar15 = pcVar9[1];
              pcVar9 = pcVar9 + 1;
            } while (cVar15 != ']');
          }
          cVar16 = cVar15;
          if (!bVar7) {
            bVar14 = true;
          }
        }
        if ((cVar16 == '\n') && (((bVar4 || bVar5) || cVar13 != '\0' || (bVar14)))) {
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
          bVar4 = false;
          cVar13 = '\0';
          bVar5 = false;
          bVar14 = false;
        }
        if (!bVar3) {
          ecs_strbuf_appendstrn(&local_578,pcVar9,1);
        }
        if ((!bVar14) && (cVar13 == '\0' && (cVar16 == '\"' || cVar16 == '\''))) {
          ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
        }
        cVar15 = pcVar9[1];
        pcVar9 = pcVar9 + 1;
      } while (cVar15 != '\0');
      if ((((bVar4) || (cVar13 != '\0')) || (bVar5)) || (bVar14)) {
        ecs_strbuf_appendstr(&local_578,"\x1b[0;49m");
      }
    }
    pcVar9 = ecs_strbuf_get(&local_578);
    if (level < 0) {
      if (level != -1) {
        if (level == -2) {
          ecs_os_warn("%swarn%s: %s%s%s%s","\x1b[0;33m","\x1b[0;49m","\x1b[0;37m",local_598,
                      "\x1b[0;49m",pcVar9);
        }
        else {
          ecs_os_err("%serr %s: %s%s%s%s","\x1b[0;31m","\x1b[0;49m","\x1b[0;37m",local_598,
                     "\x1b[0;49m",pcVar9);
        }
      }
    }
    else {
      ecs_os_log("%sinfo%s: %s%s%s%s","\x1b[0;35m","\x1b[0;49m","\x1b[0;37m",local_598,"\x1b[0;49m",
                 pcVar9);
    }
    (*ecs_os_api.free_)(pcVar9);
    (*ecs_os_api.free_)(pcVar10);
  }
  return;
}

Assistant:

static
void ecs_log_print(
    int level,
    const char *file,
    int32_t line,
    const char *fmt,
    va_list valist)
{
    (void)level;
    (void)line;

    if (level > trace_level) {
        return;
    }

    /* Massage filename so it doesn't take up too much space */
    char filebuff[256];
    ecs_os_strcpy(filebuff, file);
    file = filebuff;
    char *file_ptr = strrchr(file, '/');
    if (file_ptr) {
        file = file_ptr + 1;
    }

    /* Extension is likely the same for all files */
    file_ptr = strrchr(file, '.');
    if (file_ptr) {
        *file_ptr = '\0';
    }

    char indent[32];
    int i;
    for (i = 0; i < trace_indent; i ++) {
        indent[i * 2] = '|';
        indent[i * 2 + 1] = ' ';
    }
    indent[i * 2] = '\0';

    char *msg = ecs_vasprintf(fmt, valist);
    char *color_msg = ecs_colorize(msg);

    if (level >= 0) {
        ecs_os_log("%sinfo%s: %s%s%s%s",
            ECS_MAGENTA, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level == -2) {
        ecs_os_warn("%swarn%s: %s%s%s%s",
            ECS_YELLOW, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    } else if (level <= -2) {
        ecs_os_err("%serr %s: %s%s%s%s",
            ECS_RED, ECS_NORMAL, ECS_GREY, indent, ECS_NORMAL, color_msg);
    }

    ecs_os_free(color_msg);
    ecs_os_free(msg);
}